

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::contextCallbackOverrideCleanup
          (CLIntercept *this,cl_context context,SContextCallbackInfo **pContextCallbackInfo,
          cl_context_properties **pLocalContextProperties)

{
  mutex *__mutex;
  SContextCallbackInfo *pSVar1;
  mapped_type pSVar2;
  int iVar3;
  mapped_type *ppSVar4;
  undefined8 uVar5;
  cl_context local_28;
  
  pSVar1 = *pContextCallbackInfo;
  local_28 = context;
  if (pSVar1 == (SContextCallbackInfo *)0x0 || context == (cl_context)0x0) {
    if (pSVar1 != (SContextCallbackInfo *)0x0) {
      operator_delete(pSVar1);
    }
    *pContextCallbackInfo = (SContextCallbackInfo *)0x0;
  }
  else {
    __mutex = &this->m_Mutex;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      uVar5 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar5);
    }
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[](&this->m_ContextCallbackInfoMap,&local_28);
    if (*ppSVar4 != (mapped_type)0x0) {
      operator_delete(*ppSVar4);
    }
    pSVar2 = *pContextCallbackInfo;
    ppSVar4 = std::
              map<_cl_context_*,_CLIntercept::SContextCallbackInfo_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SContextCallbackInfo_*>_>_>
              ::operator[](&this->m_ContextCallbackInfoMap,&local_28);
    *ppSVar4 = pSVar2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (*pLocalContextProperties != (cl_context_properties *)0x0) {
    operator_delete(*pLocalContextProperties);
    *pLocalContextProperties = (cl_context_properties *)0x0;
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackOverrideCleanup(
    const cl_context context,
    SContextCallbackInfo*& pContextCallbackInfo,
    cl_context_properties*& pLocalContextProperties )
{
    if( context && pContextCallbackInfo )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // Check if we already have a context callback info for this context.  If
        // we do, free it.
        SContextCallbackInfo* pOldContextCallbackInfo =
            m_ContextCallbackInfoMap[ context ];
        if( pOldContextCallbackInfo )
        {
            delete pOldContextCallbackInfo;
            pOldContextCallbackInfo = NULL;
        }

        m_ContextCallbackInfoMap[ context ]  = pContextCallbackInfo;
    }
    else
    {
        delete pContextCallbackInfo;
        pContextCallbackInfo = NULL;
    }

    if( pLocalContextProperties )
    {
        delete pLocalContextProperties;
        pLocalContextProperties = NULL;
    }
}